

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Cues::LoadCuePoint(Cues *this)

{
  IMkvReader *pReader;
  CuePoint *this_00;
  bool bVar1;
  longlong lVar2;
  longlong lVar3;
  byte unaff_BPL;
  long lVar4;
  long lVar5;
  long lVar6;
  long len;
  long local_38;
  
  lVar6 = this->m_size + this->m_start;
  if (this->m_pos < lVar6) {
    bVar1 = Init(this);
    if (bVar1) {
      pReader = this->m_pSegment->m_pReader;
      do {
        lVar5 = this->m_pos;
        if (lVar6 <= lVar5) goto LAB_00127532;
        lVar2 = ReadID(pReader,lVar5,&local_38);
        if ((lVar2 < 0) || (lVar4 = local_38 + this->m_pos, lVar6 < lVar4)) {
          bVar1 = false;
          unaff_BPL = 0;
          goto LAB_001274ba;
        }
        this->m_pos = lVar4;
        lVar3 = ReadUInt(pReader,lVar4,&local_38);
        if ((lVar3 < 0) || (lVar4 = local_38 + this->m_pos, lVar6 < lVar4)) {
LAB_001274b1:
          bVar1 = false;
          unaff_BPL = 0;
        }
        else {
          this->m_pos = lVar4;
          if (lVar6 < lVar4 + lVar3) goto LAB_001274b1;
          if (lVar2 == 0xbb) {
            if (((0 < this->m_preload_count) &&
                (this_00 = this->m_cue_points[this->m_count], this_00 != (CuePoint *)0x0)) &&
               (lVar5 + this_00->m_timecode == 0 || -1 < this_00->m_timecode)) {
              bVar1 = CuePoint::Load(this_00,pReader);
              if (bVar1) {
                this->m_count = this->m_count + 1;
                this->m_preload_count = this->m_preload_count + -1;
                lVar5 = lVar3 + this->m_pos;
                this->m_pos = lVar5;
                unaff_BPL = lVar5 <= lVar6;
                bVar1 = false;
                goto LAB_001274ba;
              }
              this->m_pos = lVar6;
            }
            goto LAB_001274b1;
          }
          this->m_pos = lVar4 + lVar3;
          bVar1 = true;
        }
LAB_001274ba:
      } while (bVar1);
      goto LAB_00127534;
    }
    this->m_pos = lVar6;
  }
LAB_00127532:
  unaff_BPL = 0;
LAB_00127534:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool Cues::LoadCuePoint() const {
  const long long stop = m_start + m_size;

  if (m_pos >= stop)
    return false;  // nothing else to do

  if (!Init()) {
    m_pos = stop;
    return false;
  }

  IMkvReader* const pReader = m_pSegment->m_pReader;

  while (m_pos < stop) {
    const long long idpos = m_pos;

    long len;

    const long long id = ReadID(pReader, m_pos, len);
    if (id < 0 || (m_pos + len) > stop)
      return false;

    m_pos += len;  // consume ID

    const long long size = ReadUInt(pReader, m_pos, len);
    if (size < 0 || (m_pos + len) > stop)
      return false;

    m_pos += len;  // consume Size field
    if ((m_pos + size) > stop)
      return false;

    if (id != libwebm::kMkvCuePoint) {
      m_pos += size;  // consume payload
      if (m_pos > stop)
        return false;

      continue;
    }

    if (m_preload_count < 1)
      return false;

    CuePoint* const pCP = m_cue_points[m_count];
    if (!pCP || (pCP->GetTimeCode() < 0 && (-pCP->GetTimeCode() != idpos)))
      return false;

    if (!pCP->Load(pReader)) {
      m_pos = stop;
      return false;
    }
    ++m_count;
    --m_preload_count;

    m_pos += size;  // consume payload
    if (m_pos > stop)
      return false;

    return true;  // yes, we loaded a cue point
  }

  return false;  // no, we did not load a cue point
}